

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>::
Copy<JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>>
          (List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer> *this,
          List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *list)

{
  ulong uVar1;
  int32 requiredCapacity;
  
  requiredCapacity =
       (list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count;
  if (0 < requiredCapacity) {
    List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>::EnsureArray
              ((List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
               this,requiredCapacity);
    if ((0x3fffffff < (ulong)*(uint *)(this + 0x20)) ||
       (uVar1 = (ulong)(uint)(list->
                             super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).
                             count, 0x3fffffff < uVar1)) {
      Math::DefaultOverflowPolicy();
    }
    js_memcpy_s(*(void **)(this + 8),(ulong)*(uint *)(this + 0x20) << 2,
                (list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).buffer.
                ptr,uVar1 << 2);
    requiredCapacity =
         (list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count;
  }
  *(int32 *)(this + 0x10) = requiredCapacity;
  return;
}

Assistant:

void Copy(const U* list)
        {
            CompileAssert(sizeof(TElementType) == sizeof(typename U::TElementType));
            if (list->Count() > 0)
            {
                this->EnsureArray(list->Count());
                js_memcpy_s(this->buffer, UInt32Math::Mul(sizeof(TElementType), this->length), list->GetBuffer(), UInt32Math::Mul(sizeof(TElementType), list->Count()));
            }
            this->count = list->Count();
        }